

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

SliceDynamicLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_slicedynamic(NeuralNetworkLayer *this)

{
  bool bVar1;
  SliceDynamicLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_slicedynamic(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_slicedynamic(this);
    this_00 = (SliceDynamicLayerParams *)operator_new(0x88);
    SliceDynamicLayerParams::SliceDynamicLayerParams(this_00);
    (this->layer_).slicedynamic_ = this_00;
  }
  return (SliceDynamicLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::SliceDynamicLayerParams* NeuralNetworkLayer::mutable_slicedynamic() {
  if (!has_slicedynamic()) {
    clear_layer();
    set_has_slicedynamic();
    layer_.slicedynamic_ = new ::CoreML::Specification::SliceDynamicLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.sliceDynamic)
  return layer_.slicedynamic_;
}